

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O2

void __thiscall
squall::detail::KlassImp<Foo>::KlassImp(KlassImp<Foo> *this,HSQUIRRELVM vm,string *name)

{
  HSQOBJECT table;
  HSQOBJECT table_00;
  keeper k;
  
  (this->super_KlassImpBase)._vptr_KlassImpBase = (_func_int **)&PTR__KlassImp_0013c2f0;
  this->vm_ = vm;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->closed_ = false;
  make_getter_table(this);
  make_setter_table(this);
  k.vm = vm;
  k.top = sq_gettop(vm);
  sq_newclass(vm,0);
  sq_getstackobj(vm,-1,&this->sqclass_);
  sq_addref(vm,&this->sqclass_);
  table._4_4_ = 0;
  table._type = (this->getter_table_)._type;
  table._unVal.pTable = (this->getter_table_)._unVal.pTable;
  defmetamethod(this,"_get",table,delegate_get);
  table_00._4_4_ = 0;
  table_00._type = (this->setter_table_)._type;
  table_00._unVal.pTable = (this->setter_table_)._unVal.pTable;
  defmetamethod(this,"_set",table_00,delegate_set);
  keeper::~keeper(&k);
  return;
}

Assistant:

KlassImp(HSQUIRRELVM vm, const string& name)
        : vm_(vm), name_(name), closed_(false) {
        
        make_getter_table();
        make_setter_table();
        
        keeper k(vm);
        sq_newclass(vm, SQFalse);
        sq_getstackobj(vm, -1, &sqclass_);
        sq_addref(vm, &sqclass_);

        defmetamethod(_SC("_get"), getter_table_, delegate_get);
        defmetamethod(_SC("_set"), setter_table_, delegate_set);
    }